

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests.c
# Opt level: O1

int main(int ArgC,char **ArgV)

{
  int iVar1;
  
  JsonLibTests_Parsing_Register();
  JsonLibTests_Output_Register();
  JsonLibTests_Unmarshall_Register();
  JsonLibTests_Marshall_Register();
  JsonLibTests_RoundTrip_Register();
  JsonLibTests_Base64_Register();
  iVar1 = WjTestLib_Run(ArgC,ArgV);
  WjTestLib_DisplayResults();
  WjTestLib_FreeTests();
  return iVar1;
}

Assistant:

int
main
    (
        int     ArgC,
        char**  ArgV
    )
{
    int result = 0;

    // Register tests
    JsonLibTests_Parsing_Register( );
    JsonLibTests_Output_Register( );
    JsonLibTests_Unmarshall_Register( );
    JsonLibTests_Marshall_Register( );
    JsonLibTests_RoundTrip_Register( );
    JsonLibTests_Base64_Register( );

    // Run tests
    result = WjTestLib_Run( ArgC, ArgV );

    WjTestLib_DisplayResults( );
    WjTestLib_FreeTests( );

    return result;
}